

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

uint32_t __thiscall
google::protobuf::internal::ThreadSafeArena::SerialArenaChunk::safe_size(SerialArenaChunk *this)

{
  atomic<unsigned_int> *paVar1;
  uint *puVar2;
  __int_type_conflict2 local_30;
  uint32_t local_2c;
  SerialArenaChunk *local_28;
  SerialArenaChunk *this_local;
  memory_order local_18;
  int local_14;
  memory_order __b;
  
  local_28 = this;
  local_2c = capacity(this);
  paVar1 = size(this);
  local_14 = 0;
  ___b = paVar1;
  local_18 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_14 - 1U < 2) {
    this_local._4_4_ = (paVar1->super___atomic_base<unsigned_int>)._M_i;
  }
  else if (local_14 == 5) {
    this_local._4_4_ = (paVar1->super___atomic_base<unsigned_int>)._M_i;
  }
  else {
    this_local._4_4_ = (paVar1->super___atomic_base<unsigned_int>)._M_i;
  }
  local_30 = this_local._4_4_;
  puVar2 = std::min<unsigned_int>(&local_2c,&local_30);
  return *puVar2;
}

Assistant:

uint32_t safe_size() const {
    return std::min(capacity(), size().load(std::memory_order_relaxed));
  }